

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ge.cpp
# Opt level: O1

void ge_p3_tobytes(uchar *s,ge_p3 *h)

{
  int iVar1;
  fe y;
  fe x;
  fe recip;
  i32 aiStack_b8 [12];
  i32 local_88 [12];
  i32 local_58 [12];
  
  fe_invert(local_58,h->Z);
  fe_mul(local_88,h->X,local_58);
  fe_mul(aiStack_b8,h->Y,local_58);
  fe_tobytes(s,aiStack_b8);
  iVar1 = fe_isnegative(local_88);
  s[0x1f] = s[0x1f] ^ (char)iVar1 << 7;
  return;
}

Assistant:

void ge_p3_tobytes(unsigned char *s, const ge_p3 *h) {
    fe recip;
    fe x;
    fe y;
    fe_invert(recip, h->Z);
    fe_mul(x, h->X, recip);
    fe_mul(y, h->Y, recip);
    fe_tobytes(s, y);
    s[31] ^= fe_isnegative(x) << 7;
}